

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509a.cc
# Opt level: O2

int X509_CERT_AUX_print(BIO *bp,X509_CERT_AUX *x,int indent)

{
  ASN1_UTF8STRING *pAVar1;
  size_t sVar2;
  ASN1_OBJECT *pAVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char oidstr [80];
  
  if (x != (X509_CERT_AUX *)0x0) {
    uVar7 = (ulong)(uint)indent;
    if (x->trust == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Trusted Uses.\n",uVar7,"");
    }
    else {
      bVar6 = false;
      BIO_printf(bp,"%*sTrusted Uses:\n%*s",uVar7,"",(ulong)(indent + 2),"");
      for (uVar8 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->trust), uVar8 < sVar2;
          uVar8 = uVar8 + 1) {
        if (bVar6) {
          BIO_puts(bp,", ");
        }
        pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->trust,uVar8);
        OBJ_obj2txt(oidstr,0x50,pAVar3,0);
        BIO_puts(bp,oidstr);
        bVar6 = true;
      }
      BIO_puts(bp,"\n");
    }
    if (x->reject == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Rejected Uses.\n",uVar7,"");
    }
    else {
      bVar6 = false;
      BIO_printf(bp,"%*sRejected Uses:\n%*s",uVar7,"",(ulong)(indent + 2),"");
      for (uVar8 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->reject), uVar8 < sVar2;
          uVar8 = uVar8 + 1) {
        if (bVar6) {
          BIO_puts(bp,", ");
        }
        pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->reject,uVar8);
        OBJ_obj2txt(oidstr,0x50,pAVar3,0);
        BIO_puts(bp,oidstr);
        bVar6 = true;
      }
      BIO_puts(bp,"\n");
    }
    pAVar1 = x->alias;
    if (pAVar1 != (ASN1_UTF8STRING *)0x0) {
      BIO_printf(bp,"%*sAlias: %.*s\n",uVar7,"",(ulong)(uint)pAVar1->length,pAVar1->data);
    }
    if (x->keyid != (ASN1_OCTET_STRING *)0x0) {
      BIO_printf(bp,"%*sKey Id: ",uVar7,"");
      for (lVar5 = 0; lVar5 < x->keyid->length; lVar5 = lVar5 + 1) {
        pcVar4 = ":";
        if (lVar5 == 0) {
          pcVar4 = "";
        }
        BIO_printf(bp,"%s%02X",pcVar4,(ulong)x->keyid->data[lVar5]);
      }
      BIO_write(bp,"\n",1);
    }
  }
  return 1;
}

Assistant:

int X509_CERT_AUX_print(BIO *out, X509_CERT_AUX *aux, int indent) {
  char oidstr[80], first;
  size_t i;
  int j;
  if (!aux) {
    return 1;
  }
  if (aux->trust) {
    first = 1;
    BIO_printf(out, "%*sTrusted Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->trust); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->trust, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Trusted Uses.\n", indent, "");
  }
  if (aux->reject) {
    first = 1;
    BIO_printf(out, "%*sRejected Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->reject); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->reject, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Rejected Uses.\n", indent, "");
  }
  if (aux->alias) {
    BIO_printf(out, "%*sAlias: %.*s\n", indent, "", aux->alias->length,
               aux->alias->data);
  }
  if (aux->keyid) {
    BIO_printf(out, "%*sKey Id: ", indent, "");
    for (j = 0; j < aux->keyid->length; j++) {
      BIO_printf(out, "%s%02X", j ? ":" : "", aux->keyid->data[j]);
    }
    BIO_write(out, "\n", 1);
  }
  return 1;
}